

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::TypeRefType>
          (ASTSerializer *this,TypeRefType *elem,bool inMembersArray)

{
  string_view value;
  string_view value_00;
  string_view name;
  const_iterator pos_;
  bool bVar1;
  equal_to<const_void_*> *peVar2;
  void **ppvVar3;
  size_t sVar4;
  void **__y;
  uchar *puVar5;
  byte in_DL;
  TypeRefType *in_RSI;
  SourceManager *in_RDI;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range6;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  SourceManager *sm;
  locator loc;
  size_t pos0;
  size_t hash;
  void **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  iterator it;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  Symbol *in_stack_fffffffffffffb28;
  char_pointer *p_00;
  Compilation *in_stack_fffffffffffffb30;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *this_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffb38;
  ASTSerializer *in_stack_fffffffffffffb40;
  size_t in_stack_fffffffffffffb48;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *in_stack_fffffffffffffb50;
  JsonWriter *in_stack_fffffffffffffb60;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *ptVar6;
  Type *in_stack_fffffffffffffb68;
  void **in_stack_fffffffffffffb90;
  SourceManager *hash_00;
  SourceManager *this_01;
  SourceLocation in_stack_fffffffffffffba8;
  SourceLocation in_stack_fffffffffffffbc0;
  SourceLocation in_stack_fffffffffffffbc8;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_428;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_420;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_408;
  int local_3f8;
  void *local_3f0;
  SourceLocation local_3e8;
  int local_3e0;
  void *local_3d8;
  SourceLocation local_3d0;
  int local_3c8;
  void *local_3c0;
  SourceLocation local_3b8;
  string_view local_3b0;
  int local_3a0;
  void *local_398;
  SourceManager *local_390;
  string_view local_388;
  int local_378;
  void *local_370;
  size_t local_368;
  char *local_360;
  int local_358;
  void *local_350;
  __sv_type local_328;
  undefined1 local_318 [8];
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_310 [3];
  __sv_type local_2c8;
  byte local_2b1;
  TypeRefType *local_2b0;
  undefined1 *local_2a0;
  SourceManager *local_298;
  void **local_290;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_288;
  undefined1 *local_280;
  SourceManager *local_278;
  bool local_269 [25];
  iterator local_250;
  bool local_239 [25];
  iterator local_220;
  bool local_209;
  iterator local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
  local_1f8;
  size_t local_1e0;
  size_t local_1d8;
  void **local_1d0;
  undefined1 *local_1c8;
  SourceManager *local_1c0;
  uint local_1b4;
  value_type *local_1b0;
  value_type *local_1a8;
  uint local_19c;
  group_type *local_198;
  size_t local_190;
  pow2_quadratic_prober local_188;
  size_t local_178;
  size_t local_170;
  void **local_168;
  SourceManager *local_160;
  table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
  local_158;
  char_pointer local_148;
  table_element_pointer ppvStack_140;
  iterator local_138;
  char_pointer local_128;
  table_element_pointer ppvStack_120;
  void **local_118;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_110;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
  local_100;
  void **local_e8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_e0;
  iterator local_d8;
  char_pointer local_c8;
  table_element_pointer ppvStack_c0;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_b0;
  char_pointer local_a8;
  table_element_pointer ppvStack_a0;
  table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
  *local_98;
  size_t local_90;
  void **local_88;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_80;
  uint local_74;
  value_type *local_70;
  value_type *local_68;
  uint local_5c;
  group_type *local_58;
  size_t local_50;
  pow2_quadratic_prober local_48;
  size_t local_38;
  size_t local_30;
  void **local_28;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_20;
  table_element_type *local_18;
  uchar *local_10;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *local_8;
  
  local_2b1 = in_DL & 1;
  if (((in_RDI->mutex)._M_impl._M_rwlock.__size[0x12] & 1U) == 0) {
    Type::toString_abi_cxx11_(in_stack_fffffffffffffb68);
    local_2c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffb30);
    value._M_str = (char *)in_stack_fffffffffffffb50;
    value._M_len = in_stack_fffffffffffffb48;
    JsonWriter::writeValue((JsonWriter *)in_stack_fffffffffffffb40,value);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb30);
  }
  else {
    hash_00 = (SourceManager *)((long)&(in_RDI->mutex)._M_impl._M_rwlock + 0x18);
    local_2a0 = local_318;
    local_2b0 = in_RSI;
    local_298 = hash_00;
    local_280 = local_2a0;
    local_278 = hash_00;
    local_1c8 = local_2a0;
    local_1c0 = hash_00;
    local_1d0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                ::key_from<void_const*>((void **)0x5970c5);
    local_1d8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                ::hash_for<void_const*>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            *)in_stack_fffffffffffffb30,(void **)in_stack_fffffffffffffb28);
    local_1e0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                *)in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
    local_168 = local_1d0;
    local_178 = local_1d8;
    this_01 = hash_00;
    local_170 = local_1e0;
    local_160 = hash_00;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_188,local_1e0);
    do {
      local_190 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_188);
      local_198 = boost::unordered::detail::foa::
                  table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                  ::groups((table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                            *)0x59717f);
      local_198 = local_198 + local_190;
      local_19c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
      if (local_19c != 0) {
        local_1a8 = boost::unordered::detail::foa::
                    table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                    ::elements((table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                                *)0x5971ca);
        local_1b0 = local_1a8 + local_190 * 0xf;
        do {
          local_1b4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          peVar2 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                           *)0x59721a);
          in_stack_fffffffffffffb90 = local_168;
          ppvVar3 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                    ::key_from<void_const*>((void **)0x597247);
          bVar1 = std::equal_to<const_void_*>::operator()(peVar2,in_stack_fffffffffffffb90,ppvVar3);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
            ::table_locator(&local_1f8,local_198,local_1b4,local_1b0 + local_1b4);
            goto LAB_0059733b;
          }
          local_19c = local_19c - 1 & local_19c;
        } while (local_19c != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
      if (bVar1) {
        memset(&local_1f8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
        ::table_locator(&local_1f8);
        goto LAB_0059733b;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_188,*(size_t *)((long)&(this_01->mutex)._M_impl._M_rwlock + 8));
    } while (bVar1);
    memset(&local_1f8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
    ::table_locator(&local_1f8);
LAB_0059733b:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_1f8);
    if (bVar1) {
      local_208 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  ::make_iterator((locator *)0x59735b);
      local_209 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_310,&local_208,&local_209);
    }
    else if ((hash_00->mutex)._M_impl._M_rwlock.__data.__pad2 <
             *(ulong *)((long)&(hash_00->mutex)._M_impl._M_rwlock + 0x20)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::unchecked_emplace_at<void_const*>
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 (size_t)in_stack_fffffffffffffb40,&in_stack_fffffffffffffb38->_M_ptr);
      local_220 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  ::make_iterator((locator *)0x5973db);
      local_239[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_310,&local_220,local_239);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::unchecked_emplace_with_rehash<void_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  *)this_01,(size_t)hash_00,in_stack_fffffffffffffb90);
      local_250 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  ::make_iterator((locator *)0x597441);
      local_269[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_310,&local_250,local_269);
    }
    if (((local_310[0].second ^ 0xffU) & 1) == 0) {
      if ((local_2b0->super_Type).super_Symbol.kind != TransparentMember) {
        JsonWriter::startObject((JsonWriter *)in_stack_fffffffffffffb50);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                   (char *)in_stack_fffffffffffffb38);
        local_368 = (local_2b0->super_Type).super_Symbol.name._M_len;
        local_360 = (local_2b0->super_Type).super_Symbol.name._M_str;
        write((ASTSerializer *)in_RDI,local_358,local_350,local_368);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                   (char *)in_stack_fffffffffffffb38);
        local_388 = ast::toString(Unknown);
        write((ASTSerializer *)in_RDI,local_378,local_370,local_388._M_len);
        if ((((in_RDI->mutex)._M_impl._M_rwlock.__size[0x11] & 1U) != 0) &&
           (local_390 = Compilation::getSourceManager
                                  ((Compilation *)(in_RDI->mutex)._M_impl._M_rwlock.__align),
           local_390 != (SourceManager *)0x0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                     (char *)in_stack_fffffffffffffb38);
          local_3b8 = (local_2b0->super_Type).super_Symbol.location;
          local_3b0 = SourceManager::getFileName(in_RDI,in_stack_fffffffffffffbc0);
          write((ASTSerializer *)in_RDI,local_3a0,local_398,local_3b0._M_len);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                     (char *)in_stack_fffffffffffffb38);
          local_3d0 = (local_2b0->super_Type).super_Symbol.location;
          sVar4 = SourceManager::getLineNumber
                            ((SourceManager *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8);
          write((ASTSerializer *)in_RDI,local_3c8,local_3c0,sVar4);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                     (char *)in_stack_fffffffffffffb38);
          local_3e8 = (local_2b0->super_Type).super_Symbol.location;
          sVar4 = SourceManager::getColumnNumber(this_01,in_stack_fffffffffffffba8);
          write((ASTSerializer *)in_RDI,local_3e0,local_3d8,sVar4);
        }
        if (((in_RDI->mutex)._M_impl._M_rwlock.__size[0x10] & 1U) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                     (char *)in_stack_fffffffffffffb38);
          write((ASTSerializer *)in_RDI,local_3f8,local_3f0,(size_t)local_2b0);
        }
        local_408 = Compilation::getAttributes(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                          ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *
                           )0x5977f0);
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb40,
                     (char *)in_stack_fffffffffffffb38);
          name._M_str = (char *)in_stack_fffffffffffffb50;
          name._M_len = in_stack_fffffffffffffb48;
          startArray(in_stack_fffffffffffffb40,name);
          local_420 = &local_408;
          local_428._M_current =
               (AttributeSymbol **)
               std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffb28);
          std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                    (in_stack_fffffffffffffb38);
          while (bVar1 = __gnu_cxx::
                         operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                   ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffb30,
                                    (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffb28), ((bVar1 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
            ::operator*(&local_428);
            serialize((ASTSerializer *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,false);
            __gnu_cxx::
            __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
            ::operator++(&local_428);
          }
          endArray((ASTSerializer *)0x5978cb);
        }
        TypeRefType::serializeTo(local_2b0,(ASTSerializer *)in_RDI);
        JsonWriter::endObject(in_stack_fffffffffffffb60);
        this_00 = (table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                   *)((long)&(in_RDI->mutex)._M_impl._M_rwlock + 0x18);
        local_290 = (void **)&stack0xfffffffffffffbc0;
        ptVar6 = this_00;
        local_288 = this_00;
        local_118 = local_290;
        local_110 = this_00;
        local_e8 = local_290;
        local_e0 = this_00;
        local_88 = local_290;
        local_80 = this_00;
        local_90 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                   ::hash_for<void_const*>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                               *)in_stack_fffffffffffffb30,(void **)in_stack_fffffffffffffb28);
        ppvVar3 = local_88;
        local_30 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                   *)in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
        local_38 = local_90;
        local_28 = ppvVar3;
        local_20 = ptVar6;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_48,local_30);
        do {
          local_50 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_48);
          local_58 = boost::unordered::detail::foa::
                     table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                     ::groups((table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                               *)0x597a41);
          local_58 = local_58 + local_50;
          local_5c = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
          if (local_5c != 0) {
            local_68 = boost::unordered::detail::foa::
                       table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                       ::elements((table_arrays<const_void_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_void_*>_>
                                   *)0x597a8c);
            local_70 = local_68 + local_50 * 0xf;
            do {
              local_74 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              peVar2 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                       ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                               *)0x597adc);
              ppvVar3 = local_28;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                    ::key_from<void_const*>((void **)0x597b09);
              bVar1 = std::equal_to<const_void_*>::operator()(peVar2,ppvVar3,__y);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
                ::table_locator(&local_100,local_58,local_74,local_70 + local_74);
                goto LAB_00597bfd;
              }
              local_5c = local_5c - 1 & local_5c;
            } while (local_5c != 0);
          }
          bVar1 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
          if (bVar1) {
            memset(&local_100,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
            ::table_locator(&local_100);
            goto LAB_00597bfd;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_48,(ptVar6->arrays).groups_size_mask);
        } while (bVar1);
        memset(&local_100,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
        ::table_locator(&local_100);
LAB_00597bfd:
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                   ::make_iterator((locator *)0x597c0a);
        local_128 = local_d8.pc_;
        ppvStack_120 = local_d8.p_;
        local_138 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                    ::end((table<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                           *)0x597c44);
        bVar1 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffb30,
                           (table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffb28);
        if (bVar1) {
          local_148 = local_128;
          ppvStack_140 = ppvStack_120;
          local_98 = &local_158;
          local_a8 = local_128;
          ppvStack_a0 = ppvStack_120;
          p_00 = &local_a8;
          local_b0 = this_00;
          puVar5 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                   ::pc((table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                         *)0x597cdd);
          local_18 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                     ::p((table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)0x597ceb);
          local_10 = puVar5;
          local_8 = this_00;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
          ::destroy_element(this_00,p_00);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
          ::recover_slot(this_00,(uchar *)p_00);
          local_c8 = local_a8;
          ppvStack_c0 = ppvStack_a0;
          pos_.p_ = ppvStack_a0;
          pos_.pc_ = local_a8;
          boost::unordered::detail::foa::
          table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
          ::table_erase_return_type(&local_158,pos_);
        }
      }
    }
    else {
      Type::toString_abi_cxx11_(in_stack_fffffffffffffb68);
      local_328 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb30);
      value_00._M_str = (char *)in_stack_fffffffffffffb50;
      value_00._M_len = in_stack_fffffffffffffb48;
      JsonWriter::writeValue((JsonWriter *)in_stack_fffffffffffffb40,value_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
    }
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}